

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

BOOL __thiscall Js::HeapArgumentsObject::DeleteItemAt(HeapArgumentsObject *this,uint32 index)

{
  Recycler *this_00;
  BOOLEAN BVar1;
  Recycler *alloc;
  BVSparse<Memory::Recycler> *pBVar2;
  BOOL BVar3;
  Type *this_01;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  BVar3 = 0;
  if (index < this->formalCount) {
    this_01 = &this->deletedArgs;
    pBVar2 = (this->deletedArgs).ptr;
    if (pBVar2 == (BVSparse<Memory::Recycler> *)0x0) {
      this_00 = ((((((this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.type.
                    ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                recycler;
      local_60 = (undefined1  [8])&BVSparse<Memory::Recycler>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_5a962ea;
      data.filename._0_4_ = 0x9d;
      data._32_8_ = this_01;
      alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_60);
      pBVar2 = (BVSparse<Memory::Recycler> *)new<Memory::Recycler>(0x20,alloc,0x37a1d4);
      this_01 = (Type *)data._32_8_;
      BVSparse<Memory::Recycler>::BVSparse(pBVar2,this_00);
      Memory::WriteBarrierPtr<BVSparse<Memory::Recycler>_>::WriteBarrierSet(this_01,pBVar2);
      pBVar2 = (this->deletedArgs).ptr;
    }
    BVar1 = BVSparse<Memory::Recycler>::Test(pBVar2,index);
    if (BVar1 == '\0') {
      BVSparse<Memory::Recycler>::Set(this_01->ptr,index);
      BVar3 = 1;
    }
  }
  return BVar3;
}

Assistant:

BOOL HeapArgumentsObject::DeleteItemAt(uint32 index)
    {
        if (index < formalCount)
        {
            if (this->deletedArgs == nullptr)
            {
                Recycler *recycler = GetScriptContext()->GetRecycler();
                deletedArgs = RecyclerNew(recycler, BVSparse<Recycler>, recycler);
            }

            if (!this->deletedArgs->Test(index))
            {
                this->deletedArgs->Set(index);
                return true;
            }
        }

        return false;
    }